

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgFunctionGenerator.cpp
# Opt level: O3

void __thiscall rsg::FunctionGenerator::generate(FunctionGenerator *this)

{
  Variable *variable;
  Function *pFVar1;
  ConstValueRangeAccess valueRange;
  ConstValueRangeAccess valueRange_00;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ValueEntry *pVVar4;
  AssignStatement *this_00;
  pointer pSVar5;
  Scalar *__dest;
  pointer pSVar6;
  pointer ppVVar7;
  vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_> statementStack;
  Statement *childStatement;
  Statement **local_f8;
  iterator iStack_f0;
  Statement **local_e8;
  ValueRange *in_stack_ffffffffffffff20;
  pointer in_stack_ffffffffffffff28;
  Scalar *in_stack_ffffffffffffff30;
  ValueRange local_b0;
  
  local_f8 = (Statement **)0x0;
  iStack_f0._M_current = (Statement **)0x0;
  local_e8 = (Statement **)0x0;
  this->m_state->m_statementStack =
       (vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_> *)&local_f8;
  local_b0.m_type._0_8_ = &this->m_function->m_functionBlock;
  std::vector<rsg::Statement*,std::allocator<rsg::Statement*>>::emplace_back<rsg::Statement*>
            ((vector<rsg::Statement*,std::allocator<rsg::Statement*>> *)&local_f8,
             (Statement **)&local_b0);
  BlockStatement::init(&this->m_function->m_functionBlock,(EVP_PKEY_CTX *)this->m_state);
  if (local_f8 != iStack_f0._M_current) {
    do {
      iVar3 = (*iStack_f0._M_current[-1]->_vptr_Statement[2])
                        (iStack_f0._M_current[-1],this->m_state);
      local_b0.m_type._0_8_ = CONCAT44(extraout_var,iVar3);
      if ((BlockStatement *)local_b0.m_type._0_8_ == (BlockStatement *)0x0) {
        iStack_f0._M_current = iStack_f0._M_current + -1;
      }
      else if (iStack_f0._M_current == local_e8) {
        std::vector<rsg::Statement*,std::allocator<rsg::Statement*>>::
        _M_realloc_insert<rsg::Statement*const&>
                  ((vector<rsg::Statement*,std::allocator<rsg::Statement*>> *)&local_f8,iStack_f0,
                   (Statement **)&local_b0);
      }
      else {
        *iStack_f0._M_current = (Statement *)local_b0.m_type._0_8_;
        iStack_f0._M_current = iStack_f0._M_current + 1;
      }
    } while (local_f8 != iStack_f0._M_current);
  }
  ppVVar7 = (this->m_requiredAssignments).
            super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppVVar7 !=
      (this->m_requiredAssignments).
      super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      variable = *ppVVar7;
      pVVar4 = VariableManager::getValue(this->m_state->m_varManager,variable);
      ValueRange::ValueRange(&local_b0,&variable->m_type);
      pSVar5 = (pVVar4->m_valueRange).m_min.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar6 = (pointer)0x0;
      if (pSVar5 != (pVVar4->m_valueRange).m_min.
                    super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        pSVar6 = pSVar5;
      }
      pSVar5 = (pointer)0x0;
      if (local_b0.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_b0.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar5 = local_b0.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      }
      iVar3 = VariableType::getScalarSize(&local_b0.m_type);
      if (iVar3 != 0) {
        memmove(pSVar5,pSVar6,(long)iVar3 << 2);
      }
      pSVar5 = (pVVar4->m_valueRange).m_max.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar6 = (pointer)0x0;
      if (pSVar5 != (pVVar4->m_valueRange).m_max.
                    super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        pSVar6 = pSVar5;
      }
      __dest = (Scalar *)0x0;
      if (local_b0.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_b0.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        __dest = local_b0.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      }
      iVar3 = VariableType::getScalarSize(&local_b0.m_type);
      if (iVar3 != 0) {
        memmove(__dest,pSVar6,(long)iVar3 << 2);
      }
      VariableManager::removeValueFromCurrentScope(this->m_state->m_varManager,variable);
      valueRange_00.m_min = in_stack_ffffffffffffff28;
      valueRange_00.m_type = &in_stack_ffffffffffffff20->m_type;
      valueRange_00.m_max = in_stack_ffffffffffffff30;
      bVar2 = isUndefinedValueRange(valueRange_00);
      if (!bVar2) {
        pFVar1 = this->m_function;
        this_00 = (AssignStatement *)operator_new(0x18);
        in_stack_ffffffffffffff28 = (pointer)0x0;
        if (local_b0.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_b0.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          in_stack_ffffffffffffff28 =
               local_b0.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        in_stack_ffffffffffffff30 = (Scalar *)0x0;
        if (local_b0.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_b0.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          in_stack_ffffffffffffff30 =
               local_b0.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        valueRange.m_min = in_stack_ffffffffffffff28;
        valueRange.m_type = &local_b0.m_type;
        valueRange.m_max = in_stack_ffffffffffffff30;
        in_stack_ffffffffffffff20 = &local_b0;
        AssignStatement::AssignStatement(this_00,this->m_state,variable,valueRange);
        BlockStatement::addChild(&pFVar1->m_functionBlock,(Statement *)this_00);
      }
      ValueRange::~ValueRange(&local_b0);
      ppVVar7 = ppVVar7 + 1;
    } while (ppVVar7 !=
             (this->m_requiredAssignments).
             super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_f8 != (Statement **)0x0) {
    operator_delete(local_f8,(long)local_e8 - (long)local_f8);
  }
  return;
}

Assistant:

void FunctionGenerator::generate (void)
{
	std::vector<Statement*>	statementStack;

	// Initialize
	m_state.setStatementStack(statementStack);
	statementStack.push_back(&m_function.getBody());
	m_function.getBody().init(m_state);

	// Process until statement stack is empty
	while (!statementStack.empty())
	{
		DE_ASSERT((int)statementStack.size() <= m_state.getShaderParameters().maxStatementDepth);

		Statement*	curStatement	= statementStack.back();
		Statement*	childStatement	= curStatement->createNextChild(m_state);

		if (childStatement)
			statementStack.push_back(childStatement);
		else
			statementStack.pop_back();
	}

	// Create assignments if variables have bound value range
	for (vector<Variable*>::iterator i = m_requiredAssignments.begin(); i != m_requiredAssignments.end(); i++)
	{
		Variable*				variable		= *i;
		const ValueEntry*		entry			= m_state.getVariableManager().getValue(variable);
		ValueRange				valueRange(variable->getType());

		valueRange.getMin() = entry->getValueRange().getMin().value();
		valueRange.getMax() = entry->getValueRange().getMax().value();

		// Remove value entry from this scope. After this entry ptr is invalid.
		m_state.getVariableManager().removeValueFromCurrentScope(variable);

		if (!isUndefinedValueRange(valueRange.asAccess()))
			m_function.getBody().addChild(new AssignStatement(m_state, variable, valueRange.asAccess()));
	}
}